

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TimingControlExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TimingControlExpressionSyntax,slang::syntax::TimingControlSyntax&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,TimingControlSyntax *args,ExpressionSyntax *args_1)

{
  TimingControlExpressionSyntax *pTVar1;
  size_t in_RDX;
  ExpressionSyntax *in_RSI;
  BumpAllocator *in_RDI;
  TimingControlExpressionSyntax *unaff_retaddr;
  
  pTVar1 = (TimingControlExpressionSyntax *)allocate(in_RDI,(size_t)in_RSI,in_RDX);
  slang::syntax::TimingControlExpressionSyntax::TimingControlExpressionSyntax
            (unaff_retaddr,(TimingControlSyntax *)in_RDI,in_RSI);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }